

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O2

bool __thiscall SQArray::Set(SQArray *this,SQInteger nidx,SQObjectPtr *val)

{
  bool bVar1;
  
  bVar1 = nidx < (long)(this->_values)._size;
  if (bVar1 && -1 < nidx) {
    SQObjectPtr::operator=((this->_values)._vals + nidx,val);
  }
  return bVar1 && -1 < nidx;
}

Assistant:

bool Set(const SQInteger nidx,const SQObjectPtr &val)
    {
        if(nidx>=0 && nidx<(SQInteger)_values.size()){
            _values[nidx]=val;
            return true;
        }
        else return false;
    }